

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool SingleTreeSearchHelperBoolTolerance
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBoolTolerance *a_result)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ON_RTreeBranch *a_branchA;
  ON__INT_PTR *pOVar4;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar5;
  
  a_branchA = a_nodeA->m_branch;
  iVar1 = a_nodeA->m_count;
  iVar2 = a_nodeB->m_count;
  if ((a_nodeA->m_level < 1) && (a_nodeB->m_level < 1)) {
    if (iVar1 < 1) {
      return true;
    }
    do {
      paVar5 = &a_nodeB->m_branch[0].field_1;
      if (0 < iVar2) {
        do {
          if (((a_branchA < (ON_RTreeBranch *)(paVar5 + -6)) &&
              (bVar3 = PairSearchOverlapHelper
                                 (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar5 + -6),
                                  a_result->m_tolerance), bVar3)) &&
             (bVar3 = (*a_result->m_resultCallbackBoolTolerance)
                                (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                                 (ON__INT_PTR)paVar5->m_child,&a_result->m_tolerance), !bVar3)) {
            return false;
          }
          pOVar4 = (ON__INT_PTR *)(paVar5 + 1);
          paVar5 = paVar5 + 7;
        } while (pOVar4 < a_nodeB->m_branch + iVar2);
      }
      a_branchA = a_branchA + 1;
    } while (a_branchA < a_nodeA->m_branch + iVar1);
  }
  else {
    if (&a_nodeA->m_branch[(long)iVar1 + -1].field_1 <= a_nodeA) {
      return true;
    }
    do {
      paVar5 = &a_nodeB->m_branch[0].field_1;
      if (a_nodeB < &a_nodeB->m_branch[(long)iVar2 + -1].field_1) {
        do {
          bVar3 = PairSearchOverlapHelper
                            (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar5 + -6),a_result->m_tolerance)
          ;
          if (bVar3) {
            if (a_nodeA->m_level < 1) {
              bVar3 = SingleTreeSearchHelperBoolTolerance(a_branchA,paVar5->m_child,a_result);
            }
            else if (a_nodeB->m_level < 1) {
              bVar3 = SingleTreeSearchHelperBoolTolerance
                                ((a_branchA->field_1).m_child,(ON_RTreeBranch *)(paVar5 + -6),
                                 a_result);
            }
            else {
              bVar3 = SingleTreeSearchHelperBoolTolerance
                                ((a_branchA->field_1).m_child,paVar5->m_child,a_result);
            }
            if (bVar3 == false) {
              return false;
            }
          }
          pOVar4 = (ON__INT_PTR *)(paVar5 + 1);
          paVar5 = paVar5 + 7;
        } while (pOVar4 < a_nodeB->m_branch + iVar2);
      }
      a_branchA = a_branchA + 1;
    } while (a_branchA < a_nodeA->m_branch + iVar1);
  }
  return true;
}

Assistant:

static bool SingleTreeSearchHelperBoolTolerance(const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBoolTolerance* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;

  if (a_nodeA->m_level > 0 || a_nodeB->m_level > 0)
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (a_nodeA->m_level > 0)
          {
            if (a_nodeB->m_level > 0)
            {
              if (!SingleTreeSearchHelperBoolTolerance(branchA->m_child, branchB->m_child, a_result))
                return false;
            }
            else
            {
              if (!SingleTreeSearchHelperBoolTolerance(branchA->m_child, branchB, a_result))
                return false;
            }
          }
          else // a_nodeB->m_level > 0
          {
            if (!SingleTreeSearchHelperBoolTolerance(branchA, branchB->m_child, a_result))
              return false;
          }
        }
      }
      branchA++;
    }
  }
  else
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        // branchA and branchB are leaf nodes in the same same tree.
        // Don't test pairs twice and don't test a node against itself.
        if (branchA < branchB)
        {
          if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
          {
            if (!a_result->m_resultCallbackBoolTolerance(a_result->m_context, branchA->m_id, branchB->m_id, &a_result->m_tolerance))
              return false;
          }
        }
      }
      branchA++;
    }
  }

  return true;
}